

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_allocator::allocate_string(xml_allocator *this,size_t length)

{
  undefined2 *puVar1;
  ulong uVar2;
  undefined2 local_58;
  bool local_4b;
  bool local_49;
  ptrdiff_t page_offset;
  xml_memory_string_header *header;
  xml_memory_page *page;
  size_t full_size;
  size_t size;
  size_t length_local;
  xml_allocator *this_local;
  
  full_size = length + 4;
  page = (xml_memory_page *)(length + 0xb & 0xfffffffffffffff8);
  size = length;
  length_local = (size_t)this;
  puVar1 = (undefined2 *)allocate_memory(this,(size_t)page,(xml_memory_page **)&header);
  if (puVar1 == (undefined2 *)0x0) {
    this_local = (xml_allocator *)0x0;
  }
  else {
    uVar2 = (long)puVar1 + (-0x28 - (long)header);
    if ((uVar2 & 7) != 0) {
      __assert_fail("page_offset % xml_memory_block_alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2a1,
                    "char_t *pugi::impl::(anonymous namespace)::xml_allocator::allocate_string(size_t)"
                   );
    }
    local_49 = 0x7ffff < uVar2;
    if (local_49) {
      __assert_fail("page_offset >= 0 && static_cast<size_t>(page_offset) < max_encoded_offset",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2a2,
                    "char_t *pugi::impl::(anonymous namespace)::xml_allocator::allocate_string(size_t)"
                   );
    }
    *puVar1 = (short)(uVar2 >> 3);
    if (((ulong)page & 7) != 0) {
      __assert_fail("full_size % xml_memory_block_alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2a6,
                    "char_t *pugi::impl::(anonymous namespace)::xml_allocator::allocate_string(size_t)"
                   );
    }
    local_4b = true;
    if ((xml_memory_page *)0x7ffff < page) {
      local_4b = *(xml_memory_page **)(header + 6) == page && uVar2 == 0;
    }
    if (!local_4b) {
      __assert_fail("full_size < max_encoded_offset || (page->busy_size == full_size && page_offset == 0)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2a7,
                    "char_t *pugi::impl::(anonymous namespace)::xml_allocator::allocate_string(size_t)"
                   );
    }
    if (page < (xml_memory_page *)0x80000) {
      local_58 = (undefined2)((ulong)page >> 3);
    }
    else {
      local_58 = 0;
    }
    puVar1[1] = local_58;
    this_local = (xml_allocator *)(puVar1 + 2);
  }
  return (char_t *)this_local;
}

Assistant:

char_t* allocate_string(size_t length)
		{
			static const size_t max_encoded_offset = (1 << 16) * xml_memory_block_alignment;

			PUGI_IMPL_STATIC_ASSERT(xml_memory_page_size <= max_encoded_offset);

			// allocate memory for string and header block
			size_t size = sizeof(xml_memory_string_header) + length * sizeof(char_t);

			// round size up to block alignment boundary
			size_t full_size = (size + (xml_memory_block_alignment - 1)) & ~(xml_memory_block_alignment - 1);

			xml_memory_page* page;
			xml_memory_string_header* header = static_cast<xml_memory_string_header*>(allocate_memory(full_size, page));

			if (!header) return 0;

			// setup header
			ptrdiff_t page_offset = reinterpret_cast<char*>(header) - reinterpret_cast<char*>(page) - sizeof(xml_memory_page);

			assert(page_offset % xml_memory_block_alignment == 0);
			assert(page_offset >= 0 && static_cast<size_t>(page_offset) < max_encoded_offset);
			header->page_offset = static_cast<uint16_t>(static_cast<size_t>(page_offset) / xml_memory_block_alignment);

			// full_size == 0 for large strings that occupy the whole page
			assert(full_size % xml_memory_block_alignment == 0);
			assert(full_size < max_encoded_offset || (page->busy_size == full_size && page_offset == 0));
			header->full_size = static_cast<uint16_t>(full_size < max_encoded_offset ? full_size / xml_memory_block_alignment : 0);

			// round-trip through void* to avoid 'cast increases required alignment of target type' warning
			// header is guaranteed a pointer-sized alignment, which should be enough for char_t
			return static_cast<char_t*>(static_cast<void*>(header + 1));
		}